

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_getline(BGZF *fp,int delim,kstring_t *str)

{
  int iVar1;
  void *pvVar2;
  hFILE *phVar3;
  size_t sVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  size_t __size;
  size_t __n;
  
  pvVar2 = fp->uncompressed_block;
  str->l = 0;
  do {
    if (fp->block_length <= fp->block_offset) {
      iVar7 = bgzf_read_block(fp);
      bVar10 = 1;
      if (iVar7 != 0) {
        iVar7 = -2;
        goto LAB_0013488b;
      }
      if (fp->block_length == 0) {
        iVar7 = -1;
        goto LAB_0013488b;
      }
    }
    iVar7 = fp->block_length;
    iVar1 = fp->block_offset;
    bVar5 = iVar1 < iVar7;
    iVar11 = iVar1;
    if ((iVar1 < iVar7) && (lVar13 = (long)iVar1, (uint)*(byte *)((long)pvVar2 + lVar13) != delim))
    {
      lVar12 = 0;
      do {
        if ((1 - iVar7) + iVar1 + (int)lVar12 == 0) {
          bVar5 = lVar12 + lVar13 + 1 < (long)iVar7;
          iVar11 = iVar7;
          goto LAB_001347cd;
        }
        lVar6 = lVar12 + lVar13 + 1;
        lVar12 = lVar12 + 1;
      } while ((uint)*(byte *)((long)pvVar2 + lVar6) != delim);
      bVar5 = lVar13 + lVar12 < (long)iVar7;
      iVar11 = (int)lVar12 + iVar1;
    }
LAB_001347cd:
    __n = (size_t)(iVar11 - iVar1);
    uVar8 = str->l + __n + 1;
    if (str->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      __size = (uVar8 >> 0x10 | uVar8) + 1;
      str->m = __size;
      pcVar9 = (char *)realloc(str->s,__size);
      str->s = pcVar9;
    }
    memcpy(str->s + str->l,(void *)((long)fp->block_offset + (long)pvVar2),__n);
    str->l = str->l + __n;
    iVar7 = fp->block_offset + (iVar11 - iVar1) + 1;
    fp->block_offset = iVar7;
    if (fp->block_length <= iVar7) {
      phVar3 = fp->fp;
      fp->block_address = (int64_t)(phVar3->begin + (phVar3->offset - (long)phVar3->buffer));
      fp->block_length = 0;
      fp->block_offset = 0;
    }
  } while (!bVar5);
  iVar7 = 1;
  bVar10 = 0;
LAB_0013488b:
  sVar4 = str->l;
  if (!(bool)(bVar10 & sVar4 == 0)) {
    fp->uncompressed_address = fp->uncompressed_address + sVar4;
    if ((delim == 10 && sVar4 != 0) && (str->s[sVar4 - 1] == '\r')) {
      str->l = sVar4 - 1;
    }
    str->s[str->l] = '\0';
    iVar7 = (int)str->l;
  }
  return iVar7;
}

Assistant:

int bgzf_getline(BGZF *fp, int delim, kstring_t *str)
{
    int l, state = 0;
    unsigned char *buf = (unsigned char*)fp->uncompressed_block;
    str->l = 0;
    do {
        if (fp->block_offset >= fp->block_length) {
            if (bgzf_read_block(fp) != 0) { state = -2; break; }
            if (fp->block_length == 0) { state = -1; break; }
        }
        for (l = fp->block_offset; l < fp->block_length && buf[l] != delim; ++l);
        if (l < fp->block_length) state = 1;
        l -= fp->block_offset;
        if (str->l + l + 1 >= str->m) {
            str->m = str->l + l + 2;
            kroundup32(str->m);
            str->s = (char*)realloc(str->s, str->m);
        }
        memcpy(str->s + str->l, buf + fp->block_offset, l);
        str->l += l;
        fp->block_offset += l + 1;
        if (fp->block_offset >= fp->block_length) {
            fp->block_address = htell(fp->fp);
            fp->block_offset = 0;
            fp->block_length = 0;
        }
    } while (state == 0);
    if (str->l == 0 && state < 0) return state;
    fp->uncompressed_address += str->l;
    if ( delim=='\n' && str->l>0 && str->s[str->l-1]=='\r' ) str->l--;
    str->s[str->l] = 0;
    return str->l;
}